

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNode * __thiscall Parser::call(Parser *this,Token *id)

{
  pointer pcVar1;
  Testlist *pTVar2;
  CallExpr *this_00;
  undefined8 extraout_RAX;
  long lVar3;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> newArray;
  Token closeParen;
  Token openParen;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> local_238;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> local_218;
  undefined1 local_200 [32];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  char local_ca;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Token local_a0;
  
  Tokenizer::getToken(&local_a0,this->tokenizer);
  if (local_a0._symbol == '(') {
    pTVar2 = testList(this);
    local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < (int)((ulong)((long)(pTVar2->_list).
                                super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pTVar2->_list).
                               super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3)) {
      lVar3 = 0;
      do {
        local_110._0_8_ =
             (pTVar2->_list).super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar3];
        std::vector<ExprNode*,std::allocator<ExprNode*>>::emplace_back<ExprNode*>
                  ((vector<ExprNode*,std::allocator<ExprNode*>> *)&local_238,(ExprNode **)local_110)
        ;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)((ulong)((long)(pTVar2->_list).
                                           super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pTVar2->_list).
                                          super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    Tokenizer::getToken((Token *)local_110,this->tokenizer);
    if (local_ca == ')') {
      this_00 = (CallExpr *)operator_new(0xa0);
      pcVar1 = (id->_name)._M_dataplus._M_p;
      local_200._0_8_ = local_200 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_200,pcVar1,pcVar1 + (id->_name)._M_string_length);
      pcVar1 = (id->_relOp)._M_dataplus._M_p;
      local_1e0._M_p = (pointer)&local_1d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar1,pcVar1 + (id->_relOp)._M_string_length);
      local_1c0._0_1_ = id->_eof;
      local_1c0._1_1_ = id->_eol;
      local_1c0._2_1_ = id->_ind;
      local_1c0._3_1_ = id->_ded;
      uStack_1bc._0_1_ = id->_isWholeNumber;
      uStack_1bc._1_1_ = id->_isString;
      uStack_1bc._2_1_ = id->_symbol;
      uStack_1bc._3_1_ = id->field_0x47;
      uStack_1b8 = *(undefined4 *)&id->_wholeNumber;
      uStack_1b4 = *(undefined4 *)((long)&id->_wholeNumber + 4);
      pcVar1 = (id->_string)._M_dataplus._M_p;
      local_1b0._M_p = (pointer)&local_1a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar1,pcVar1 + (id->_string)._M_string_length);
      std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector(&local_218,&local_238);
      CallExpr::CallExpr(this_00,(Token *)local_200,&local_218);
      if (local_218.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_218.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_218.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p != &local_e0) {
        operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
      }
      if ((ExprNode *)local_110._0_8_ != (ExprNode *)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._string._M_dataplus._M_p != &local_a0._string.field_2) {
        operator_delete(local_a0._string._M_dataplus._M_p,
                        local_a0._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._relOp._M_dataplus._M_p != &local_a0._relOp.field_2) {
        operator_delete(local_a0._relOp._M_dataplus._M_p,
                        local_a0._relOp.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._name._M_dataplus._M_p != &local_a0._name.field_2) {
        operator_delete(local_a0._name._M_dataplus._M_p,
                        local_a0._name.field_2._M_allocated_capacity + 1);
      }
      return &this_00->super_ExprNode;
    }
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Parser::callStmt","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"Expected an ( sign, instead got","");
    die(this,&local_130,&local_150,&local_a0);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Parser::callStmt","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Expected an ) sign, instead got","");
  die(this,&local_170,&local_190,(Token *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  Token::~Token((Token *)local_110);
  if (local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Token::~Token(&local_a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ExprNode *Parser::call(Token id) {
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::callStmt", "Expected an ( sign, instead got", openParen);
    Testlist *callTestlist = testList();
    std::vector<ExprNode*>newArray;
    for(int i = 0; i < callTestlist->numTests();i++){
        newArray.push_back(callTestlist->at(i));
    }
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::callStmt", "Expected an ) sign, instead got", closeParen);
//    CallStatement *callStatement = new CallStatement(id.getName(), callTestlist);
    auto *callExpr = new CallExpr(id, newArray);

    return callExpr;
    //CallExpr *callExpr = new CallExpr()
    //callToken.setWholeNumber(callStatement->evaluate());
    //return new WholeNumber(callToken);

}